

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::Decode
          (Mode5TransponderBasicData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    (*(this->m_Status).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Status,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16PIN);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32MsgFormats);
    (*(this->m_EM1Code).super_ModeXCodeRecord.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EM1Code,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NationalOrigin);
    (*(this->m_SupplementalData).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_SupplementalData,stream);
    KDataStream::Read(stream,&this->m_ui8NavSrc);
    KDataStream::Read(stream,&this->m_ui8FigMerit);
    KDataStream::Read(stream,&this->m_ui8Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5TransponderBasicData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < MODE_5_TRANSPONDER_BASIC_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_Status
           >> m_ui16PIN
           >> m_ui32MsgFormats
           >> KDIS_STREAM m_EM1Code
           >> m_ui16NationalOrigin
           >> KDIS_STREAM m_SupplementalData
           >> m_ui8NavSrc
           >> m_ui8FigMerit
           >> m_ui8Padding;
}